

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

void __thiscall
nanojson3::json::json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::write_string
          (json_writer<std::ostreambuf_iterator<char,_std::char_traits<char>_>_> *this,
          js_string_view val)

{
  byte __c;
  size_t sVar1;
  size_t sVar2;
  string_view view;
  
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
            ((ostreambuf_iterator<char,_std::char_traits<char>_> *)this,'\"');
  for (sVar2 = 0; val._M_len != sVar2; sVar2 = sVar2 + 1) {
    __c = val._M_str[sVar2];
    sVar1 = write_string::char_table_._M_elems[__c]._M_len;
    if (sVar1 == 0) {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
                ((ostreambuf_iterator<char,_std::char_traits<char>_> *)this,__c);
    }
    else {
      view._M_str = write_string::char_table_._M_elems[__c]._M_str;
      view._M_len = sVar1;
      output_stream::operator<<(&this->output_,view);
    }
  }
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
            ((ostreambuf_iterator<char,_std::char_traits<char>_> *)this,'\"');
  return;
}

Assistant:

void write_string(const js_string_view val)
        {
            using namespace std::string_view_literals;

            output_ << '"';
            for (auto c : val)
            {
                static constexpr std::array<std::string_view, 256> char_table_
                {
                    /* 00 */"\\u0000", "\\u0001", "\\u0002", "\\u0003", "\\u0004", "\\u0005", "\\u0006", "\\u0007", "\\b", "\\t", "\\n", "\\u000B", "\\u000C", "\\r", "\\u000E", "\\u000F",
                    /* 10 */"\\u0010", "\\u0011", "\\f", "\\u0013", "\\u0014", "\\u0015", "\\u0016", "\\u0017", "\\u0018", "\\u0019", "\\u001A", "\\u001B", "\\u001C", "\\u001D", "\\u001E", "\\u001F",
                    /* 20 */{}, {}, "\\\"", {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\/",
                    /* 30 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 40 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 50 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\\\", {}, {}, {},
                    /* 60 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {},
                    /* 70 */{}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, {}, "\\u007F",
                    /* 80 */{}, // ... continue to 0xFF
                };

                if (auto p = char_table_[static_cast<uint8_t>(c)]; !p.empty())
                    output_ << p;
                else
                    output_ << c;
            }
            output_ << '"';
        }